

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_8da176::HandleRealPathCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  string *__u;
  offset_in_Arguments_to_bool in_RCX;
  ActionMap *pAVar5;
  bool bVar6;
  string_view value;
  static_string_view name;
  static_string_view name_00;
  value_type input;
  cmCMakePath path;
  string realPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unparsedArguments;
  Arguments arguments;
  allocator<char> local_1a9;
  ActionMap *local_1a8;
  long local_1a0;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [24];
  _Any_data _Stack_160;
  undefined1 auStack_150 [16];
  _Any_data _Stack_140;
  pointer ppStack_130;
  pointer local_128;
  pointer ppStack_120;
  undefined1 local_118 [40];
  undefined1 local_f0 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [24];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>
  local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  char local_40;
  char local_38;
  
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x41) {
    local_188._0_8_ = (ActionMap *)local_178;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_188,"REAL_PATH requires a path and an output variable","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((ActionMap *)local_188._0_8_ != (ActionMap *)local_178) {
      operator_delete((void *)local_188._0_8_,(ulong)(local_178._0_8_ + 1));
    }
    return false;
  }
  if (((anonymous_namespace)::
       HandleRealPathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleRealPathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar4 != 0)) {
    local_128 = (pointer)0x0;
    ppStack_120 = (pointer)0x0;
    _Stack_140._8_8_ = (_Manager_type)0x0;
    ppStack_130 = (pointer)0x0;
    auStack_150._8_8_ = 0;
    _Stack_140._0_8_ = 0;
    _Stack_160._8_8_ = 0;
    auStack_150._0_8_ = (_Manager_type)0x0;
    local_178._16_8_ =
         (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
    _Stack_160._M_unused._M_object = (char *)0x0;
    local_178._0_8_ = (pointer)0x0;
    local_178._8_8_ = (pointer)0x0;
    local_188._0_8_ = (ActionMap *)0x0;
    local_188._8_8_ = (ParseResult *)0x0;
    name.super_string_view._M_str = "BASE_DIRECTORY";
    name.super_string_view._M_len = 0xe;
    cmArgumentParser<(anonymous_namespace)::HandleRealPathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::optional<std::__cxx11::string>>
              ((cmArgumentParser<(anonymous_namespace)::HandleRealPathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_188,name,in_RCX);
    name_00.super_string_view._M_str = "EXPAND_TILDE";
    name_00.super_string_view._M_len = 0xc;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_188,name_00,in_RCX)
    ;
    ArgumentParser::ActionMap::ActionMap
              ((ActionMap *)&HandleRealPathCommand::parser,(ActionMap *)local_188);
    ArgumentParser::Base::~Base((Base *)local_188);
    __cxa_atexit(ArgumentParser::Base::~Base,&HandleRealPathCommand::parser,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         HandleRealPathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  local_178._0_8_ = local_a8;
  local_a8._0_8_ = (pointer)0x0;
  local_a8._8_8_ = (pointer)0x0;
  local_a8._16_8_ = (pointer)0x0;
  local_f0._8_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_f0._0_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start + 3;
  local_90.second.super__Function_base._M_functor._8_8_ = &local_90.first._M_str;
  local_90.first._M_str._0_4_ = 0;
  local_90.second.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_90.second._M_invoker = (_Invoker_type)0x0;
  local_40 = '\0';
  local_38 = '\0';
  local_188._0_8_ = &HandleRealPathCommand::parser;
  local_188._8_8_ = local_a8 + 0x18;
  local_178._16_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  _Stack_160._M_unused._M_object = (char *)0x0;
  _Stack_160._8_8_ = 0;
  auStack_150._0_8_ = (_Manager_type)0x0;
  auStack_150._8_8_ = 0;
  _Stack_140._0_8_ = 0;
  _Stack_140._8_8_ = (_Manager_type)0x0;
  ppStack_130 = (pointer)0x0;
  local_128 = (pointer)((ulong)local_128 & 0xffffffffffffff00);
  local_178._8_8_ = local_188._8_8_;
  local_90.second.super__Function_base._M_manager =
       (_Manager_type)local_90.second.super__Function_base._M_functor._8_8_;
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)local_188,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_f0,0);
  if ((_Manager_type)_Stack_140._8_8_ != (_Manager_type)0x0) {
    (*(code *)_Stack_140._8_8_)(auStack_150 + 8,auStack_150 + 8,3);
  }
  bVar6 = local_a8._0_8_ == local_a8._8_8_;
  if (bVar6) {
    bVar3 = ArgumentParser::ParseResult::MaybeReportError
                      ((ParseResult *)(local_a8 + 0x18),status->Makefile);
    if (bVar3) goto LAB_0026a12f;
    if (local_40 == '\0') {
      __u = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
      std::optional<std::__cxx11::string>::operator=
                ((optional<std::__cxx11::string> *)&local_60,__u);
    }
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pcVar2 = pbVar1[1]._M_dataplus._M_p;
    local_1a8 = (ActionMap *)local_198;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1a8,pcVar2,pcVar2 + pbVar1[1]._M_string_length);
    if ((((local_38 == '\x01') && (local_1a0 != 0)) &&
        (*(char *)&(((Base *)&local_1a8->Keywords)->Bindings).Keywords.
                   super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                   .
                   super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                   ._M_impl.super__Vector_impl_data == '~')) &&
       ((local_1a0 == 1 ||
        (*(char *)((long)&(((Base *)&local_1a8->Keywords)->Bindings).Keywords.
                          super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                          .
                          super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                          ._M_impl.super__Vector_impl_data + 1) == '/')))) {
      local_188._8_8_ = (pointer)0x0;
      local_178._0_8_ = local_178._0_8_ & 0xffffffffffffff00;
      local_188._0_8_ = (ActionMap *)local_178;
      bVar3 = cmsys::SystemTools::GetEnv("HOME",(string *)local_188);
      if (bVar3) {
        std::__cxx11::string::replace((ulong)&local_1a8,0,&DAT_00000001,local_188._0_8_);
      }
      if ((ActionMap *)local_188._0_8_ != (ActionMap *)local_178) {
        operator_delete((void *)local_188._0_8_,(ulong)(local_178._0_8_ + 1));
      }
    }
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,local_1a8,
               (undefined1 *)
               ((long)&(((Base *)&local_1a8->Keywords)->Bindings).Keywords.
                       super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                       .
                       super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                       ._M_impl.super__Vector_impl_data + local_1a0));
    cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
              ((cmCMakePath *)local_188,&local_c8,auto_format);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    cmCMakePath::Absolute<std::__cxx11::string,cmCMakePath&>
              ((cmCMakePath *)local_118,(cmCMakePath *)local_188,&local_60);
    cmCMakePath::Normal((cmCMakePath *)local_f0,(cmCMakePath *)local_118);
    cmCMakePath::operator=((cmCMakePath *)local_188,(cmCMakePath *)local_f0);
    std::filesystem::__cxx11::path::~path((path *)local_f0);
    std::filesystem::__cxx11::path::~path((path *)local_118);
    std::filesystem::__cxx11::path::generic_string<char,std::char_traits<char>,std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
               (path *)local_188,&local_1a9);
    cmsys::SystemTools::GetRealPath((string *)local_f0,(string *)local_118,(string *)0x0);
    if ((pointer)local_118._0_8_ != (pointer)(local_118 + 0x10)) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
    value._M_str = (char *)local_f0._0_8_;
    value._M_len = local_f0._8_8_;
    cmMakefile::AddDefinition
              (status->Makefile,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 2,value);
    if ((pointer)local_f0._0_8_ != (pointer)(local_f0 + 0x10)) {
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
    }
    std::filesystem::__cxx11::path::~path((path *)local_188);
    pAVar5 = local_1a8;
    if (local_1a8 == (ActionMap *)local_198) goto LAB_0026a12f;
  }
  else {
    local_188._0_8_ = (ActionMap *)local_178;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_188,"REAL_PATH called with unexpected arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_198._0_8_ = local_178._0_8_;
    pAVar5 = (ActionMap *)local_188._0_8_;
    if ((ActionMap *)local_188._0_8_ == (ActionMap *)local_178) goto LAB_0026a12f;
  }
  operator_delete(pAVar5,(ulong)((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)&((pointer)local_198._0_8_)->first)->_M_impl).
                                        super__Vector_impl_data._M_start + 1));
LAB_0026a12f:
  if ((local_40 == '\x01') &&
     (local_40 = '\0',
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)local_60._M_dataplus._M_p != &local_60.field_2)) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_a8 + 0x18));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_a8);
  return bVar6;
}

Assistant:

bool HandleRealPathCommand(std::vector<std::string> const& args,
                           cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("REAL_PATH requires a path and an output variable");
    return false;
  }

  struct Arguments : public ArgumentParser::ParseResult
  {
    cm::optional<std::string> BaseDirectory;
    bool ExpandTilde = false;
  };
  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("BASE_DIRECTORY"_s, &Arguments::BaseDirectory)
      .Bind("EXPAND_TILDE"_s, &Arguments::ExpandTilde);

  std::vector<std::string> unparsedArguments;
  auto arguments =
    parser.Parse(cmMakeRange(args).advance(3), &unparsedArguments);

  if (!unparsedArguments.empty()) {
    status.SetError("REAL_PATH called with unexpected arguments");
    return false;
  }
  if (arguments.MaybeReportError(status.GetMakefile())) {
    return true;
  }

  if (!arguments.BaseDirectory) {
    arguments.BaseDirectory = status.GetMakefile().GetCurrentSourceDirectory();
  }

  auto input = args[1];
  if (arguments.ExpandTilde && !input.empty()) {
    if (input[0] == '~' && (input.length() == 1 || input[1] == '/')) {
      std::string home;
      if (
#if defined(_WIN32) && !defined(__CYGWIN__)
        cmSystemTools::GetEnv("USERPROFILE", home) ||
#endif
        cmSystemTools::GetEnv("HOME", home)) {
        input.replace(0, 1, home);
      }
    }
  }

  cmCMakePath path(input, cmCMakePath::auto_format);
  path = path.Absolute(*arguments.BaseDirectory).Normal();
  auto realPath = cmSystemTools::GetRealPath(path.GenericString());

  status.GetMakefile().AddDefinition(args[2], realPath);

  return true;
}